

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>::
insert<kj::HashMap<kj::String,int>::Entry,kj::StringPtr&>
          (HashIndex<kj::HashMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::String,_int>::Entry> table,size_t pos,char (*params) [7])

{
  uint uVar1;
  long lVar2;
  long lVar3;
  void *__s2;
  size_t __n;
  uint uVar4;
  int iVar5;
  long lVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar8;
  HashIndex<kj::HashMap<kj::String,_int>::Callbacks> *this_00;
  char *__s1;
  undefined8 *in_R9;
  HashBucket *_s944;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *paVar9;
  uint uVar10;
  long lVar11;
  ArrayPtr<const_unsigned_char> s;
  Maybe<unsigned_long> MVar12;
  
  this_00 = (HashIndex<kj::HashMap<kj::String,_int>::Callbacks> *)table.ptr;
  if ((ulong)(*(long *)(this_00 + 0x18) * 2) < (*(long *)(this_00 + 8) + pos) * 3 + 3) {
    HashIndex<kj::HashMap<kj::String,_int>::Callbacks>::rehash(this_00,pos * 3 + 3);
  }
  s.size_ = in_R9[1] - 1;
  s.ptr = (uchar *)*in_R9;
  uVar4 = _::HashCoder::operator*((HashCoder *)&_::HASHCODER,s);
  lVar2 = *(long *)(this_00 + 0x10);
  lVar3 = *(long *)(this_00 + 0x18);
  uVar10 = (int)lVar3 - 1U & uVar4;
  __s2 = (void *)*in_R9;
  __n = in_R9[1];
  paVar9 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0;
  do {
    paVar7 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
             (lVar2 + (ulong)uVar10 * 8);
    uVar1 = *(uint *)((long)paVar7 + 4);
    if (uVar1 == 1) {
      if (paVar9 == (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
        paVar9 = paVar7;
      }
    }
    else {
      if (uVar1 == 0) {
        if (paVar9 != (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)0x0) {
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + -1;
          paVar7 = paVar9;
        }
        aVar8.value = ((ulong)uVar4 | (long)params << 0x20) + 0x200000000;
        paVar7->value = (unsigned_long)aVar8;
        *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x0;
        goto LAB_00175361;
      }
      if (*(uint *)paVar7 == uVar4) {
        lVar6 = (ulong)(uVar1 - 2) * 0x20;
        lVar11 = *(long *)(table.size_ + 8 + lVar6);
        if (lVar11 + (ulong)(lVar11 == 0) == __n) {
          __s1 = "";
          if (lVar11 != 0) {
            __s1 = *(char **)(lVar6 + table.size_);
          }
          iVar5 = bcmp(__s1,__s2,__n);
          if (iVar5 == 0) {
            *this = (HashIndex<kj::HashMap<kj::String,int>::Callbacks>)0x1;
            *(ulong *)(this + 8) = (ulong)(uVar1 - 2);
            aVar8 = extraout_RDX;
LAB_00175361:
            MVar12.ptr.field_1.value = aVar8.value;
            MVar12.ptr._0_8_ = this;
            return (Maybe<unsigned_long>)MVar12.ptr;
          }
        }
      }
    }
    lVar11 = (ulong)uVar10 + 1;
    uVar10 = (uint)lVar11;
    if (lVar11 == lVar3) {
      uVar10 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }